

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O1

shared_ptr<gui::Label> __thiscall gui::Slider::getLabel(Slider *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<gui::Label> sVar2;
  shared_ptr<gui::Label> sVar3;
  
  (in_RDI->super_Widget).super_Drawable._vptr_Drawable =
       (_func_int **)
       (this->label_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1 = (element_type *)
           (this->label_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (in_RDI->super_Widget).super_enable_shared_from_this<gui::Widget>._M_weak_this.
  super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  if (peVar1 != (element_type *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      *(int *)&(peVar1->super_enable_shared_from_this<gui::Widget>)._M_weak_this.
               super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(peVar1->super_enable_shared_from_this<gui::Widget>)._M_weak_this.
                    super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      sVar2.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar2.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<gui::Label>)
             sVar2.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    *(int *)&(peVar1->super_enable_shared_from_this<gui::Widget>)._M_weak_this.
             super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(int *)&(peVar1->super_enable_shared_from_this<gui::Widget>)._M_weak_this.
                  super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    UNLOCK();
  }
  sVar3.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar3.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<gui::Label>)sVar3.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Label> Slider::getLabel() const {
    return label_;
}